

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extendable_data_dictionary.cpp
# Opt level: O1

optional<bidfx_public_api::price::pixie::FieldDef> * __thiscall
bidfx_public_api::price::pixie::ExtendableDataDictionary::FieldDefByName
          (optional<bidfx_public_api::price::pixie::FieldDef> *__return_storage_ptr__,
          ExtendableDataDictionary *this,string *field_name)

{
  iterator iVar1;
  bool bVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>_>
          ::find(&(this->field_def_by_name_)._M_t,field_name);
  bVar2 = (_Rb_tree_header *)iVar1._M_node !=
          &(this->field_def_by_name_)._M_t._M_impl.super__Rb_tree_header;
  if (bVar2) {
    FieldDef::FieldDef((FieldDef *)__return_storage_ptr__,(FieldDef *)(iVar1._M_node + 2));
  }
  (__return_storage_ptr__->
  super__Optional_base<bidfx_public_api::price::pixie::FieldDef,_false,_false>)._M_payload.
  super__Optional_payload<bidfx_public_api::price::pixie::FieldDef,_true,_false,_false>.
  super__Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>._M_engaged = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::optional<FieldDef> ExtendableDataDictionary::FieldDefByName(std::string field_name)
{
    auto it = field_def_by_name_.find(field_name);
    if ( it == field_def_by_name_.end())
    {
        return {};
    }
    else
    {
        return it->second;
    }
}